

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_check_word(p_ply ply)

{
  size_t sVar1;
  p_ply in_RDI;
  size_t size;
  int local_4;
  
  sVar1 = strlen(in_RDI->buffer + in_RDI->buffer_token);
  if (sVar1 < 0x100) {
    if (sVar1 == 0) {
      ply_ferror(in_RDI,"Unexpected end of file");
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    ply_ferror(in_RDI,"Word too long");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ply_check_word(p_ply ply) {
    size_t size = strlen(BWORD(ply));
    if (size >= WORDSIZE) {
        ply_ferror(ply, "Word too long");
        return 0;
    } else if (size == 0) {
        ply_ferror(ply, "Unexpected end of file");
        return 0;
    }
    return 1;
}